

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_MeshFace>::Append(ON_SimpleArray<ON_MeshFace> *this,ON_MeshFace *x)

{
  int iVar1;
  ON_MeshFace *pOVar2;
  undefined8 uVar3;
  ON_MeshFace *memblock;
  int iVar4;
  uint uVar5;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if (iVar1 < 8 || (ulong)((long)iVar1 << 4) < 0x10000001) {
      uVar5 = 4;
      if (2 < iVar1) {
        uVar5 = iVar1 * 2;
      }
    }
    else {
      iVar4 = 0x1000008;
      if (iVar1 < 0x1000008) {
        iVar4 = iVar1;
      }
      uVar5 = iVar4 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_MeshFace *)onmalloc(0x10);
      uVar3 = *(undefined8 *)(x->vi + 2);
      *(undefined8 *)memblock->vi = *(undefined8 *)x->vi;
      *(undefined8 *)(memblock->vi + 2) = uVar3;
    }
    if ((uint)this->m_capacity < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    if (this->m_a == (ON_MeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  uVar3 = *(undefined8 *)(memblock->vi + 2);
  *(undefined8 *)pOVar2[iVar1].vi = *(undefined8 *)memblock->vi;
  *(undefined8 *)(pOVar2[iVar1].vi + 2) = uVar3;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}